

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

_Bool move_next(hdr_iter *iter)

{
  int iVar1;
  hdr_histogram *h;
  int64_t iVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  int index;
  long lVar7;
  long lVar8;
  
  index = iter->counts_index + 1;
  iter->counts_index = index;
  h = iter->h;
  iVar1 = h->counts_len;
  if (index < iVar1) {
    iVar2 = counts_get_normalised(h,index);
    iter->count = iVar2;
    iter->cumulative_count = iter->cumulative_count + iVar2;
    uVar3 = hdr_value_at_index(h,index);
    uVar5 = h->sub_bucket_mask | uVar3;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    bVar4 = 0x3f - (((byte)lVar7 ^ 0x3f) + (char)h->sub_bucket_half_count_magnitude);
    iVar6 = (int)((long)uVar3 >> (bVar4 & 0x3f));
    lVar8 = (long)iVar6 << (bVar4 & 0x3f);
    lVar7 = 1L << ((h->sub_bucket_count <= iVar6) + bVar4 & 0x3f);
    iter->lowest_equivalent_value = lVar8;
    iter->value = uVar3;
    iter->highest_equivalent_value = lVar8 + lVar7 + -1;
    iter->median_equivalent_value = (lVar7 >> 1) + lVar8;
  }
  return index < iVar1;
}

Assistant:

static bool move_next(struct hdr_iter* iter)
{
    iter->counts_index++;

    if (!has_buckets(iter))
    {
        return false;
    }

    iter->count = counts_get_normalised(iter->h, iter->counts_index);
    iter->cumulative_count += iter->count;
    const int64_t value = hdr_value_at_index(iter->h, iter->counts_index);
    const int32_t bucket_index = get_bucket_index(iter->h, value);
    const int32_t sub_bucket_index = get_sub_bucket_index(value, bucket_index, iter->h->unit_magnitude);
    const int64_t leq = lowest_equivalent_value_given_bucket_indices(iter->h, bucket_index, sub_bucket_index);
    const int64_t size_of_equivalent_value_range = size_of_equivalent_value_range_given_bucket_indices(
        iter->h, bucket_index, sub_bucket_index);
    iter->lowest_equivalent_value = leq;
    iter->value = value;
    iter->highest_equivalent_value = leq + size_of_equivalent_value_range - 1;
    iter->median_equivalent_value = leq + (size_of_equivalent_value_range >> 1);

    return true;
}